

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoCube>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoCube> *this,void **vtt,TPZGeoMesh *DestMesh,
          TPZGeoElRefPattern<pzgeom::TPZGeoCube> *cp)

{
  TPZGeoElRefLess<pzgeom::TPZGeoCube> *in_RDX;
  TPZGeoMesh *in_RSI;
  TPZVec<long> *in_RDI;
  TPZGeoElRefLess<pzgeom::TPZGeoCube> *unaff_retaddr;
  TPZAutoPointer<TPZRefPattern> *in_stack_ffffffffffffffa8;
  
  TPZGeoElRefLess<pzgeom::TPZGeoCube>::TPZGeoElRefLess
            (unaff_retaddr,&in_RDI->_vptr_TPZVec,in_RSI,in_RDX);
  in_RDI->_vptr_TPZVec = (in_RSI->super_TPZSavable)._vptr_TPZSavable;
  *(TPZCompMesh **)((long)&in_RDI->_vptr_TPZVec + (long)in_RDI->_vptr_TPZVec[-0xc]) =
       in_RSI->fReference;
  TPZVec<long>::TPZVec((TPZVec<long> *)&in_RDI[0x18].fNElements);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
            ((TPZAutoPointer<TPZRefPattern> *)&in_RDI[0x19].fNElements,in_stack_ffffffffffffffa8);
  TPZVec<long>::operator=(in_RDI,(TPZVec<long> *)in_RSI);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZGeoMesh &DestMesh, const TPZGeoElRefPattern<TGeo> &cp):
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(DestMesh,cp),
fRefPattern(cp.fRefPattern) {

	this->fSubEl = cp.fSubEl;
}